

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_binary.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_5::BinaryFileName
                   (string *__return_storage_ptr__,Parser *parser,string *path,string *file_name)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  byte local_4a;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string ext;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  
  ext.field_2._8_8_ = file_name;
  lVar1 = std::__cxx11::string::length();
  local_4a = 0;
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"bin",&local_49);
  }
  else {
    std::__cxx11::string::string((string *)local_48,(string *)&parser->file_extension_);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  std::operator+(&local_a0,path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ext.field_2._8_8_);
  std::operator+(&local_80,&local_a0,".");
  std::operator+(__return_storage_ptr__,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::string BinaryFileName(const Parser &parser, const std::string &path,
                                  const std::string &file_name) {
  auto ext = parser.file_extension_.length() ? parser.file_extension_ : "bin";
  return path + file_name + "." + ext;
}